

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

size_t __thiscall lattice::graph::add_bond(graph *this,size_t s,size_t t,int tp)

{
  ulong uVar1;
  size_type sVar2;
  invalid_argument *piVar3;
  vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_> *this_00;
  int in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t b;
  value_type *in_stack_ffffffffffffff78;
  value_type_conflict1 *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  bond_t local_50;
  size_type local_38;
  int local_1c;
  ulong local_18;
  ulong local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::size
                    ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
                     (in_RDI + 8));
  uVar1 = local_18;
  if (in_RSI < sVar2) {
    sVar2 = std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::size
                      ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
                       (in_RDI + 8));
    if (uVar1 < sVar2) {
      if (local_10 == local_18) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar3,"self loop is not allowed");
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_38 = std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::size
                           ((vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                             *)(in_RDI + 0x38));
      this_00 = (vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_> *)
                (in_RDI + 0x38);
      bond_t::bond_t(&local_50,local_10,local_18,local_1c);
      std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::push_back
                (this_00,in_stack_ffffffffffffff78);
      std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::operator[]
                ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
                 (in_RDI + 8),local_10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::operator[]
                ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
                 (in_RDI + 8),local_10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::operator[]
                ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
                 (in_RDI + 8),local_18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::operator[]
                ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
                 (in_RDI + 8),local_18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      return local_38;
    }
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"site index out of range");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::size_t add_bond(std::size_t s, std::size_t t, int tp) {
    if (s >= sites_.size() || t >= sites_.size())
      throw std::invalid_argument("site index out of range");
    if (s == t)
      throw std::invalid_argument("self loop is not allowed");
    std::size_t b = bonds_.size();
    bonds_.push_back(bond_t(s, t, tp));
    sites_[s].neighbors.push_back(t);
    sites_[s].neighbor_bonds.push_back(b);
    sites_[t].neighbors.push_back(s);
    sites_[t].neighbor_bonds.push_back(b);
    return b;
  }